

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O0

int cfg_schema_tobin(void *target,cfg_named_section *named,cfg_schema_entry *entries,size_t count)

{
  int iVar1;
  const_strarray *pcVar2;
  const_strarray *value;
  size_t i;
  char *ptr;
  size_t count_local;
  cfg_schema_entry *entries_local;
  cfg_named_section *named_local;
  void *target_local;
  
  value = (const_strarray *)0x0;
  do {
    if (count <= value) {
      return 0;
    }
    if (entries[(long)value].cb_to_binary !=
        (_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)0x0) {
      pcVar2 = cfg_db_get_schema_entry_value(named,entries + (long)value);
      iVar1 = (*entries[(long)value].cb_to_binary)
                        (entries + (long)value,pcVar2,
                         (void *)((long)target + entries[(long)value].bin_offset));
      if (iVar1 != 0) {
        return -1 - (int)value;
      }
    }
    value = (const_strarray *)((long)&value->value + 1);
  } while( true );
}

Assistant:

int
cfg_schema_tobin(void *target, struct cfg_named_section *named, const struct cfg_schema_entry *entries, size_t count) {
  char *ptr;
  size_t i;
  const struct const_strarray *value;

  ptr = (char *)target;

  for (i = 0; i < count; i++) {
    if (entries[i].cb_to_binary == NULL) {
      continue;
    }

    value = cfg_db_get_schema_entry_value(named, &entries[i]);
    if (entries[i].cb_to_binary(&entries[i], value, ptr + entries[i].bin_offset)) {
      /* error in conversion */
      return -1 - i;
    }
  }
  return 0;
}